

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.h
# Opt level: O0

void __thiscall
llama_model_loader::llama_tensor_weight::llama_tensor_weight
          (llama_tensor_weight *this,llama_file *file,uint16_t idx,gguf_context *gguf_ctx,
          ggml_tensor *tensor)

{
  undefined8 uVar1;
  runtime_error *prVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  undefined8 in_RCX;
  undefined2 in_DX;
  undefined2 *in_RDI;
  undefined8 in_R8;
  int tensor_idx;
  string local_80 [35];
  undefined1 local_5d;
  string local_50 [36];
  int local_2c;
  undefined8 local_28;
  undefined8 local_20;
  
  *in_RDI = in_DX;
  *(undefined8 *)(in_RDI + 8) = in_R8;
  local_28 = in_R8;
  local_20 = in_RCX;
  uVar1 = ggml_get_name(in_R8);
  local_2c = gguf_find_tensor(in_RCX,uVar1);
  if (local_2c < 0) {
    local_5d = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar1 = ggml_get_name(local_28);
    format_abi_cxx11_((char *)local_50,"tensor \'%s\' not found in the model",uVar1);
    std::runtime_error::runtime_error(prVar2,local_50);
    local_5d = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar3 = gguf_get_data_offset(local_20);
  lVar4 = gguf_get_tensor_offset(local_20,(long)local_2c);
  *(long *)(in_RDI + 4) = lVar3 + lVar4;
  lVar3 = *(long *)(in_RDI + 4);
  lVar4 = ggml_nbytes(local_28);
  if (*(ulong *)(in_RDI + 4) <= (ulong)(lVar3 + lVar4)) {
    lVar3 = *(long *)(in_RDI + 4);
    lVar4 = ggml_nbytes(local_28);
    sVar5 = llama_file::size((llama_file *)0x45b525);
    if ((ulong)(lVar3 + lVar4) <= sVar5) {
      return;
    }
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar1 = ggml_get_name(local_28);
  format_abi_cxx11_((char *)local_80,
                    "tensor \'%s\' data is not within the file bounds, model is corrupted or incomplete"
                    ,uVar1);
  std::runtime_error::runtime_error(prVar2,local_80);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

llama_tensor_weight(const llama_file * file, uint16_t idx, const struct gguf_context * gguf_ctx, ggml_tensor * tensor) : idx(idx), tensor(tensor) {
            const int tensor_idx = gguf_find_tensor(gguf_ctx,  ggml_get_name(tensor));
            if (tensor_idx < 0) {
                throw std::runtime_error(format("tensor '%s' not found in the model", ggml_get_name(tensor)));
            }

            offs = gguf_get_data_offset(gguf_ctx) + gguf_get_tensor_offset(gguf_ctx, tensor_idx);
            if (offs + ggml_nbytes(tensor) < offs || offs + ggml_nbytes(tensor) > file->size()) {
                throw std::runtime_error(format("tensor '%s' data is not within the file bounds, model is corrupted or incomplete", ggml_get_name(tensor)));
            }
        }